

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l3_fs.c
# Opt level: O0

int picnic_l3_fs_verify(picnic_l3_fs_publickey_t *pk,uint8_t *message,size_t message_len,
                       uint8_t *signature,size_t signature_len)

{
  picnic_instance_t *ppVar1;
  long in_RCX;
  long in_RDI;
  long in_R8;
  picnic_context_t context;
  uint8_t *pk_pt;
  uint8_t *pk_c;
  picnic_instance_t *instance;
  size_t in_stack_00000b80;
  uint8_t *in_stack_00000b88;
  picnic_context_t *in_stack_00000b90;
  picnic_instance_t *in_stack_00000b98;
  size_t in_stack_ffffffffffffff28;
  uint8_t *in_stack_ffffffffffffff30;
  mzd_local_t *in_stack_ffffffffffffff38;
  undefined4 local_34;
  
  if (((in_RDI == 0) || (in_RCX == 0)) || (in_R8 == 0)) {
    local_34 = -1;
  }
  else {
    ppVar1 = picnic_instance_get(Picnic_L3_FS);
    if (ppVar1 == (picnic_instance_t *)0x0) {
      local_34 = -1;
    }
    else {
      mzd_from_char_array(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                          in_stack_ffffffffffffff28);
      mzd_from_char_array(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                          in_stack_ffffffffffffff28);
      local_34 = picnic_impl_verify(in_stack_00000b98,in_stack_00000b90,in_stack_00000b88,
                                    in_stack_00000b80);
    }
  }
  return local_34;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l3_fs_verify(const picnic_l3_fs_publickey_t* pk,
                                                  const uint8_t* message, size_t message_len,
                                                  const uint8_t* signature, size_t signature_len) {
  if (!pk || !signature || !signature_len) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);
  if (!instance) {
    return -1;
  }

  const uint8_t* pk_c  = PK_C(pk);
  const uint8_t* pk_pt = PK_PT(pk);

  picnic_context_t context;
  mzd_from_char_array(context.m_plaintext, pk_pt, LOWMC_BLOCK_SZ);
  mzd_from_char_array(context.m_key, pk_c, LOWMC_BLOCK_SZ);
  context.plaintext   = PK_PT(pk);
  context.private_key = NULL;
  context.public_key  = PK_C(pk);
  context.msg         = message;
  context.msglen      = message_len;
#if defined(WITH_UNRUH)
  context.unruh = (PARAM == Picnic_L1_UR || PARAM == Picnic_L3_UR || PARAM == Picnic_L5_UR);
#endif
  return picnic_impl_verify(instance, &context, signature, signature_len);
}